

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v7::detail::bigint::align(bigint *this,bigint *other)

{
  uint *puVar1;
  type tVar2;
  uint uVar3;
  uint *puVar4;
  int iVar5;
  
  iVar5 = this->exp_ - other->exp_;
  if (iVar5 != 0 && other->exp_ <= this->exp_) {
    uVar3 = (uint)(this->bigits_).super_buffer<unsigned_int>.size_;
    tVar2 = to_unsigned<int>(iVar5 + uVar3);
    buffer<unsigned_int>::try_resize((buffer<unsigned_int> *)this,(ulong)tVar2);
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    puVar4 = puVar1 + (int)((uVar3 - 1) + iVar5);
    while (uVar3 = uVar3 - 1, -1 < (int)uVar3) {
      *puVar4 = puVar1[uVar3];
      puVar4 = puVar4 + -1;
    }
    std::__fill_n_a<unsigned_int*,int,int>(puVar1,iVar5);
    this->exp_ = this->exp_ - iVar5;
  }
  return;
}

Assistant:

void align(const bigint& other) {
    int exp_difference = exp_ - other.exp_;
    if (exp_difference <= 0) return;
    int num_bigits = static_cast<int>(bigits_.size());
    bigits_.resize(to_unsigned(num_bigits + exp_difference));
    for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
      bigits_[j] = bigits_[i];
    std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
    exp_ -= exp_difference;
  }